

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O0

void pbrt::StatRegisterer::CallCallbacks(StatsAccumulator *accum)

{
  bool bVar1;
  iterator __lhs;
  reference pp_Var2;
  undefined8 in_RDI;
  AccumFunc func;
  iterator __end1;
  iterator __begin1;
  vector<void_(*)(pbrt::StatsAccumulator_&),_std::allocator<void_(*)(pbrt::StatsAccumulator_&)>_>
  *__range1;
  vector<void_(*)(pbrt::StatsAccumulator_&),_std::allocator<void_(*)(pbrt::StatsAccumulator_&)>_>
  *in_stack_ffffffffffffffd8;
  __normal_iterator<void_(**)(pbrt::StatsAccumulator_&),_std::vector<void_(*)(pbrt::StatsAccumulator_&),_std::allocator<void_(*)(pbrt::StatsAccumulator_&)>_>_>
  local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = statFuncs;
  local_8 = in_RDI;
  local_18._M_current =
       (_func_void_StatsAccumulator_ptr **)
       std::
       vector<void_(*)(pbrt::StatsAccumulator_&),_std::allocator<void_(*)(pbrt::StatsAccumulator_&)>_>
       ::begin(in_stack_ffffffffffffffd8);
  __lhs = std::
          vector<void_(*)(pbrt::StatsAccumulator_&),_std::allocator<void_(*)(pbrt::StatsAccumulator_&)>_>
          ::end(in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<void_(**)(pbrt::StatsAccumulator_&),_std::vector<void_(*)(pbrt::StatsAccumulator_&),_std::allocator<void_(*)(pbrt::StatsAccumulator_&)>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<void_(**)(pbrt::StatsAccumulator_&),_std::vector<void_(*)(pbrt::StatsAccumulator_&),_std::allocator<void_(*)(pbrt::StatsAccumulator_&)>_>_>
                        *)in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    pp_Var2 = __gnu_cxx::
              __normal_iterator<void_(**)(pbrt::StatsAccumulator_&),_std::vector<void_(*)(pbrt::StatsAccumulator_&),_std::allocator<void_(*)(pbrt::StatsAccumulator_&)>_>_>
              ::operator*(&local_18);
    in_stack_ffffffffffffffd8 =
         (vector<void_(*)(pbrt::StatsAccumulator_&),_std::allocator<void_(*)(pbrt::StatsAccumulator_&)>_>
          *)*pp_Var2;
    (*(code *)in_stack_ffffffffffffffd8)(local_8);
    __gnu_cxx::
    __normal_iterator<void_(**)(pbrt::StatsAccumulator_&),_std::vector<void_(*)(pbrt::StatsAccumulator_&),_std::allocator<void_(*)(pbrt::StatsAccumulator_&)>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void StatRegisterer::CallCallbacks(StatsAccumulator &accum) {
    for (AccumFunc func : *statFuncs)
        func(accum);
}